

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::StringTrieBuilder::ListBranchNode::operator==(ListBranchNode *this,Node *other)

{
  long lVar1;
  long lVar2;
  UBool UVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this == (ListBranchNode *)other) {
    return '\x01';
  }
  UVar3 = Node::operator==((Node *)this,other);
  if (UVar3 == '\0') {
    bVar6 = false;
  }
  else {
    uVar4 = (ulong)this->length;
    bVar6 = (long)uVar4 < 1;
    if ((0 < (long)uVar4) && (this->units[0] == (char16_t)other[5].hash)) {
      uVar5 = 0;
      while ((this->values[uVar5] ==
              *(int *)((long)&other[4].super_UObject._vptr_UObject + uVar5 * 4 + 4) &&
             (this->equal[uVar5] == *(Node **)(&other[1].hash + uVar5 * 2)))) {
        bVar6 = uVar4 <= uVar5 + 1;
        if (uVar4 - 1 == uVar5) {
          return bVar6;
        }
        lVar2 = uVar5 + 1;
        lVar1 = uVar5 * 2;
        uVar5 = uVar5 + 1;
        if (this->units[lVar2] != *(char16_t *)((long)&other[5].hash + lVar1 + 2)) {
          return bVar6;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

UBool
StringTrieBuilder::ListBranchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const ListBranchNode &o=(const ListBranchNode &)other;
    for(int32_t i=0; i<length; ++i) {
        if(units[i]!=o.units[i] || values[i]!=o.values[i] || equal[i]!=o.equal[i]) {
            return FALSE;
        }
    }
    return TRUE;
}